

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

void * NMEADeviceThread(void *pParam)

{
  int iVar1;
  long lVar2;
  int iVar3;
  CRITICAL_SECTION *__mutex;
  NMEADATA *__dest;
  NMEADATA nmeadata;
  timespec local_418;
  NMEADATA local_408;
  
  __mutex = NMEADeviceCS;
  __dest = nmeadataNMEADevice;
  lVar2 = 0;
  do {
    if (*(void **)((long)addrsNMEADevice + lVar2 * 2) == pParam) {
      iVar3 = 0;
      memset(&local_408,0,0x3d8);
      do {
        local_418.tv_sec = (long)*(int *)((long)pParam + 0x900) / 1000;
        local_418.tv_nsec = ((long)*(int *)((long)pParam + 0x900) % 1000) * 1000000;
        nanosleep(&local_418,(timespec *)0x0);
        memset(&local_408,0,0x3d8);
        iVar1 = GetLatestDataNMEADevice((NMEADEVICE *)pParam,&local_408);
        if (iVar1 != 0) {
          iVar3 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(__dest,&local_408,0x3d8);
        *(int *)((long)resNMEADevice + lVar2) = iVar3;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitNMEADevice + lVar2) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    __dest = __dest + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE* pNMEADevice = (NMEADEVICE*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	NMEADATA nmeadata;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&nmeadata, 0, sizeof(NMEADATA));
	for (;;)
	{
		mSleep(pNMEADevice->threadperiod);
		memset(&nmeadata, 0, sizeof(NMEADATA));
		res = GetLatestDataNMEADevice(pNMEADevice, &nmeadata);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&NMEADeviceCS[id]);
		nmeadataNMEADevice[id] = nmeadata;
		resNMEADevice[id] = err;
		LeaveCriticalSection(&NMEADeviceCS[id]);
		if (bExitNMEADevice[id]) break;
	}

	return 0;
}